

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederate
helicsCreateCallbackFederate(char *fedName,HelicsFederateInfo fedInfo,HelicsError *err)

{
  FederateInfo *__args_1;
  int *in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  FederateInfo *info;
  shared_ptr<helics::Federate> fed;
  shared_ptr<helics::CallbackFederate> *in_stack_fffffffffffffd48;
  FederateInfo *in_stack_fffffffffffffd50;
  HelicsFederateInfo in_stack_fffffffffffffd58;
  FederateInfo *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  allocator<char> *in_stack_fffffffffffffd80;
  allocator<char> *__a;
  element_type *in_stack_fffffffffffffd88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd90;
  bool local_262;
  allocator<char> local_261 [13];
  FederateType in_stack_fffffffffffffdac;
  shared_ptr<helics::Federate> *in_stack_fffffffffffffdb0;
  FederateInfo *in_stack_fffffffffffffde0;
  bool local_62;
  allocator<char> local_61 [73];
  long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  HelicsFederate local_8;
  
  if ((in_RDX != (int *)0x0) && (*in_RDX != 0)) {
    return (HelicsFederate)0x0;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::shared_ptr<helics::Federate>::shared_ptr((shared_ptr<helics::Federate> *)0x1ba557);
  if (local_18 == 0) {
    local_62 = local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_62) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd90._M_pi,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd88);
    }
    else {
      __a = local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd90._M_pi,(char *)in_stack_fffffffffffffd88,__a);
      in_stack_fffffffffffffd78 = local_10;
    }
    local_62 = !local_62;
    helics::FederateInfo::FederateInfo(in_stack_fffffffffffffde0);
    std::make_shared<helics::CallbackFederate,std::__cxx11::string_const,helics::FederateInfo>
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::shared_ptr<helics::Federate>::operator=
              ((shared_ptr<helics::Federate> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::shared_ptr<helics::CallbackFederate>::~shared_ptr
              ((shared_ptr<helics::CallbackFederate> *)0x1ba626);
    helics::FederateInfo::~FederateInfo(in_stack_fffffffffffffd50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd50);
    if (local_62) {
      std::allocator<char>::~allocator(local_61);
    }
  }
  else {
    __args_1 = getFedInfo(in_stack_fffffffffffffd58,(HelicsError *)in_stack_fffffffffffffd50);
    if (__args_1 == (FederateInfo *)0x0) {
      local_8 = (HelicsFederate)0x0;
      goto LAB_001ba909;
    }
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd90._M_pi,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd88);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd90._M_pi,(char *)in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffd80);
    }
    local_262 = local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    std::make_shared<helics::CallbackFederate,std::__cxx11::string_const,helics::FederateInfo&>
              (in_stack_fffffffffffffd78,__args_1);
    std::shared_ptr<helics::Federate>::operator=
              ((shared_ptr<helics::Federate> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::shared_ptr<helics::CallbackFederate>::~shared_ptr
              ((shared_ptr<helics::CallbackFederate> *)0x1ba7d5);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd50);
    if (local_262) {
      std::allocator<char>::~allocator(local_261);
    }
  }
  std::shared_ptr<helics::Federate>::shared_ptr
            ((shared_ptr<helics::Federate> *)&stack0xfffffffffffffd88,
             (shared_ptr<helics::Federate> *)in_stack_fffffffffffffd48);
  local_8 = generateNewHelicsFederateObject(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1ba8dc);
LAB_001ba909:
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1ba916);
  return local_8;
}

Assistant:

HelicsFederate helicsCreateCallbackFederate(const char* fedName, HelicsFederateInfo fedInfo, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        if (fedInfo == nullptr) {
            fed = std::make_shared<helics::CallbackFederate>(AS_STRING(fedName), helics::FederateInfo());
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            fed = std::make_shared<helics::CallbackFederate>(AS_STRING(fedName), *info);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::CALLBACK);
}